

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Parser::ParseLibraryImports(Parser *this)

{
  bool bVar1;
  bool bVar2;
  element_type *this_00;
  char *local_70;
  reference local_68;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *importName;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
  *__range3;
  int local_40;
  bool foundDup;
  undefined1 local_30 [8];
  String name;
  Parser *this_local;
  
  name.field_2._8_8_ = this;
  do {
    bVar1 = Accept(this,Import);
    if (!bVar1) {
      return;
    }
    ParseName_abi_cxx11_((String *)local_30,this);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                       local_30);
    if (bVar1) {
      Error<>(this,"Expected valid name after \'import\' keyword");
      local_40 = 1;
    }
    else {
      bVar1 = false;
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
               ::begin(&this->m_importList);
      importName = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
                   ::end(&this->m_importList);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>_>
                                         *)&importName), bVar2) {
        local_68 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>_>
                   ::operator*(&__end3);
        bVar2 = std::operator==(local_68,(basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                          *)local_30);
        if (bVar2) {
          bVar1 = true;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>_>
        ::operator++(&__end3);
      }
      if (!bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
        ::push_back(&this->m_importList,(value_type *)local_30);
        this_00 = std::
                  __shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->m_runtime);
        bVar1 = Runtime::LibraryExists(this_00,(String *)local_30);
        if (!bVar1) {
          local_70 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::c_str
                               ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                 *)local_30);
          Error<char_const*>(this,"Could not find library named \'%s\'",&local_70);
          local_40 = 3;
          goto LAB_00153bb3;
        }
      }
      Expect(this,NewLine,(char *)0x0);
      local_40 = 0;
    }
LAB_00153bb3:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_30);
    if (local_40 != 0) {
      return;
    }
  } while( true );
}

Assistant:

inline_t void Parser::ParseLibraryImports()
	{
		while (true)
		{
			if (!Accept(SymbolType::Import))
				break;
			auto name = ParseName();
			if (name.empty())
			{
				Error("Expected valid name after 'import' keyword");
				return;
			}

			// Check to make sure we're not adding duplicates
			bool foundDup = false;
			for (auto & importName : m_importList)
			{
				if (importName == name)
				{
					foundDup = true;
					continue;
				}
			}

			// Add library to the list of imported libraries for this script
			if (!foundDup)
			{
				m_importList.push_back(name);
				if (!m_runtime->LibraryExists(name))
				{
					Error("Could not find library named '%s'", name.c_str());
					break;
				}
			}

			Expect(SymbolType::NewLine);
		}
	}